

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall
Server::SendDataVector(Server *this,vector<DataElement,_std::allocator<DataElement>_> *V,int size)

{
  ssize_t sVar1;
  int i;
  long lVar2;
  long lVar3;
  int local_34 [2];
  int size_local;
  
  sVar1 = send(this->newsockfd,local_34,4,0);
  this->n = (int)sVar1;
  if ((int)sVar1 < 0) {
    puts("ERROR writing to socket in server!");
  }
  lVar3 = 0;
  local_34[0] = size;
  for (lVar2 = 0; lVar2 < local_34[0]; lVar2 = lVar2 + 1) {
    sVar1 = send(this->newsockfd,
                 (void *)((long)((V->super__Vector_base<DataElement,_std::allocator<DataElement>_>).
                                 _M_impl.super__Vector_impl_data._M_start)->val + lVar3),0x10,0);
    this->n = (int)sVar1;
    if ((int)sVar1 < 0) {
      puts("ERROR writing to socket in server!");
    }
    lVar3 = lVar3 + 0x10;
  }
  return;
}

Assistant:

void Server::SendDataVector(std::vector<DataElement> V, int size)
{
    n = send(newsockfd, &size, sizeof(size), 0);
    if (n < 0)
        printf("ERROR writing to socket in server!\n");

    for (int i = 0; i < size; i++)
    {
        n = send(newsockfd, &V[i], sizeof(V[i]), 0);
        if (n < 0)
            printf("ERROR writing to socket in server!\n");
    }
}